

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O1

Gia_ManSup_t * Gia_ManSupStart(int nVarsMax)

{
  undefined4 uVar1;
  void *pvVar2;
  uint uVar3;
  Gia_ManSup_t *pGVar4;
  void **ppvVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *puVar11;
  void **ppvVar12;
  long lVar13;
  ulong uVar14;
  int nWords;
  ulong uVar15;
  size_t __size;
  
  if (0x14 < nVarsMax) {
    __assert_fail("nVarsMax <= 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSupMin.c"
                  ,0x43,"Gia_ManSup_t *Gia_ManSupStart(int)");
  }
  pGVar4 = (Gia_ManSup_t *)calloc(1,0x48);
  uVar3 = 1 << ((char)nVarsMax - 5U & 0x1f);
  if (nVarsMax < 6) {
    uVar3 = 1;
  }
  pGVar4->nVarsMax = nVarsMax;
  pGVar4->nWordsMax = uVar3;
  lVar8 = (long)(int)uVar3 * 4 + 8;
  __size = (long)(int)uVar3 * 4;
  ppvVar5 = (void **)malloc(lVar8 * nVarsMax);
  if (0 < nVarsMax) {
    ppvVar6 = ppvVar5 + nVarsMax;
    ppvVar12 = ppvVar5;
    uVar14 = (ulong)(uint)nVarsMax;
    do {
      *ppvVar12 = ppvVar6;
      ppvVar12 = ppvVar12 + 1;
      ppvVar6 = (void **)((long)ppvVar6 + __size);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = nVarsMax;
  pVVar7->nCap = nVarsMax;
  pVVar7->pArray = ppvVar5;
  if (0 < nVarsMax) {
    uVar14 = 0;
    do {
      pvVar2 = ppvVar5[uVar14];
      if (uVar14 < 5) {
        if (0 < (int)uVar3) {
          uVar1 = (&DAT_00934500)[uVar14];
          uVar15 = 0;
          do {
            *(undefined4 *)((long)pvVar2 + uVar15 * 4) = uVar1;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
      }
      else if (0 < (int)uVar3) {
        uVar15 = 0;
        do {
          *(uint *)((long)pvVar2 + uVar15 * 4) =
               -(uint)((1 << ((char)uVar14 - 5U & 0x1f) & (uint)uVar15) != 0);
          uVar15 = uVar15 + 1;
        } while (uVar3 != uVar15);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)nVarsMax);
  }
  pGVar4->vTruthVars = pVVar7;
  ppvVar5 = (void **)malloc(lVar8 * 0x200);
  lVar8 = 0x1000;
  lVar13 = 0;
  do {
    ppvVar5[lVar13] = (void *)((long)ppvVar5 + lVar8);
    lVar13 = lVar13 + 1;
    lVar8 = lVar8 + __size;
  } while (lVar13 != 0x200);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x200;
  pVVar7->nSize = 0x200;
  pVVar7->pArray = ppvVar5;
  pGVar4->vTruthNodes = pVVar7;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x200;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x800);
  pVVar9->pArray = piVar10;
  pGVar4->vConeCare = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x200;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x800);
  pVVar9->pArray = piVar10;
  pGVar4->vConeData = pVVar9;
  puVar11 = (uint *)malloc(__size);
  pGVar4->pTruthIn = puVar11;
  puVar11 = (uint *)malloc(__size);
  pGVar4->pTruthOut = puVar11;
  return pGVar4;
}

Assistant:

Gia_ManSup_t * Gia_ManSupStart( int nVarsMax )
{
    Gia_ManSup_t * p;
    assert( nVarsMax <= 20 );
    p = ABC_CALLOC( Gia_ManSup_t, 1 );
    p->nVarsMax    = nVarsMax;
    p->nWordsMax   = Kit_TruthWordNum( p->nVarsMax );
    p->vTruthVars  = Vec_PtrAllocTruthTables( p->nVarsMax );
    p->vTruthNodes = Vec_PtrAllocSimInfo( 512, p->nWordsMax );
    p->vConeCare   = Vec_IntAlloc( 512 );
    p->vConeData   = Vec_IntAlloc( 512 );
    p->pTruthIn    = ABC_ALLOC( unsigned, p->nWordsMax );
    p->pTruthOut   = ABC_ALLOC( unsigned, p->nWordsMax );
    return p;
}